

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_pack_priority_update(nghttp2_bufs *bufs,nghttp2_extension *frame)

{
  uint32_t *puVar1;
  nghttp2_buf_chain *pnVar2;
  int iVar3;
  nghttp2_ext_priority_update *priority_update;
  nghttp2_buf *buf;
  int rv;
  nghttp2_extension *frame_local;
  nghttp2_bufs *bufs_local;
  
  puVar1 = (uint32_t *)frame->payload;
  pnVar2 = bufs->head;
  if ((ulong)((long)(pnVar2->buf).end - (long)(pnVar2->buf).last) < *(long *)(puVar1 + 4) + 4U) {
    __assert_fail("nghttp2_buf_avail(buf) >= 4 + priority_update->field_value_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x395,
                  "int nghttp2_frame_pack_priority_update(nghttp2_bufs *, nghttp2_extension *)");
  }
  (pnVar2->buf).pos = (pnVar2->buf).pos + -9;
  nghttp2_frame_pack_frame_hd((pnVar2->buf).pos,&frame->hd);
  nghttp2_put_uint32be((pnVar2->buf).last,*puVar1);
  (pnVar2->buf).last = (pnVar2->buf).last + 4;
  iVar3 = nghttp2_bufs_add(bufs,*(void **)(puVar1 + 2),*(size_t *)(puVar1 + 4));
  if (iVar3 == 0) {
    return 0;
  }
  __assert_fail("rv == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x3a1,"int nghttp2_frame_pack_priority_update(nghttp2_bufs *, nghttp2_extension *)"
               );
}

Assistant:

int nghttp2_frame_pack_priority_update(nghttp2_bufs *bufs,
                                       nghttp2_extension *frame) {
  int rv;
  nghttp2_buf *buf;
  nghttp2_ext_priority_update *priority_update;

  /* This is required with --disable-assert. */
  (void)rv;

  priority_update = frame->payload;

  buf = &bufs->head->buf;

  assert(nghttp2_buf_avail(buf) >= 4 + priority_update->field_value_len);

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_put_uint32be(buf->last, (uint32_t)priority_update->stream_id);
  buf->last += 4;

  rv = nghttp2_bufs_add(bufs, priority_update->field_value,
                        priority_update->field_value_len);

  assert(rv == 0);

  return 0;
}